

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetAttributes
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,PropertyAttributes attributes)

{
  BOOL BVar1;
  ES5Array *arr;
  uint32 local_2c [2];
  uint32 index;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_2c);
  if (BVar1 == 0) {
    BVar1 = DictionaryTypeHandlerBase<unsigned_short>::SetAttributes
                      (&this->super_DictionaryTypeHandlerBase<unsigned_short>,instance,propertyId,
                       attributes);
  }
  else {
    arr = VarTo<Js::ES5Array,Js::DynamicObject>(instance);
    BVar1 = SetItemAttributes(this,arr,instance,local_2c[0],attributes);
  }
  return BVar1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return SetItemAttributes(VarTo<ES5Array>(instance), instance, index, attributes);
        }

        return __super::SetAttributes(instance, propertyId, attributes);
    }